

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264.c
# Opt level: O1

int h264_pred_weight_table(bitstream *str,h264_slice *slice,h264_pred_weight_table *table)

{
  uint uVar1;
  uint uVar2;
  h264_pred_weight_table_entry *phVar3;
  ulong uVar4;
  
  uVar1 = vs_ue(str,&table->luma_log2_weight_denom);
  uVar2 = vs_ue(str,&table->chroma_log2_weight_denom);
  uVar2 = uVar2 | uVar1;
  phVar3 = table->l0;
  uVar4 = 0xffffffffffffffff;
  do {
    uVar1 = h264_pred_weight_table_entry(str,table,phVar3);
    uVar2 = uVar2 | uVar1;
    uVar4 = uVar4 + 1;
    phVar3 = phVar3 + 1;
  } while (uVar4 < slice->num_ref_idx_l0_active_minus1);
  if (slice->slice_type * -0x33333333 + 0x33333333 < 0x33333333) {
    phVar3 = table->l1;
    uVar4 = 0xffffffffffffffff;
    do {
      uVar1 = h264_pred_weight_table_entry(str,table,phVar3);
      uVar2 = uVar2 | uVar1;
      uVar4 = uVar4 + 1;
      phVar3 = phVar3 + 1;
    } while (uVar4 < slice->num_ref_idx_l1_active_minus1);
  }
  return uVar2;
}

Assistant:

int h264_pred_weight_table(struct bitstream *str, struct h264_slice *slice, struct h264_pred_weight_table *table) {
	int ret = 0;
	ret |= vs_ue(str, &table->luma_log2_weight_denom);
	ret |= vs_ue(str, &table->chroma_log2_weight_denom);
	int i;
	for (i = 0; i <= slice->num_ref_idx_l0_active_minus1; i++)
		ret |= h264_pred_weight_table_entry(str, table, &table->l0[i]);
	if (slice->slice_type % 5 == 1)
		for (i = 0; i <= slice->num_ref_idx_l1_active_minus1; i++)
			ret |= h264_pred_weight_table_entry(str, table, &table->l1[i]);
	return ret;
}